

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctime_s.c
# Opt level: O2

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    /* TODO: System Clock DST */
    time_t t;
    char s[27];

    /* TODO: Constraint handling */

    t = -2147483648l;
    TESTCASE( ctime_s( s, 27, &t ) == 0 );
    TESTCASE( strcmp( s, "Fri Dec 13 21:45:52 1901\n" ) == 0 );

    t = 2147483647l;
    TESTCASE( ctime_s( s, 27, &t ) == 0 );
    TESTCASE( strcmp( s, "Tue Jan 19 04:14:07 2038\n" ) == 0 );
#endif

    return TEST_RESULTS;
}